

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

bool dg::vr::Relations::isSigned(Type type)

{
  int in_EDI;
  undefined1 local_1;
  
  if (in_EDI - 2U < 2) {
LAB_00102cc4:
    local_1 = true;
  }
  else {
    if (1 < in_EDI - 4U) {
      if (in_EDI - 6U < 2) goto LAB_00102cc4;
      if (1 < in_EDI - 8U) {
        abort();
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Relations::isSigned(Type type) {
    switch (type) {
    case SLT:
    case SLE:
    case SGT:
    case SGE:
        return true;
    case ULT:
    case ULE:
    case UGT:
    case UGE:
        return false;
    default:
        assert(0 && "unreachable");
        abort();
    }
}